

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O1

void __thiscall slang::ast::InstanceSymbol::resolvePortConnections(InstanceSymbol *this)

{
  char *pcVar1;
  undefined4 uVar2;
  InstanceBodySymbol *pIVar3;
  pointer ppSVar4;
  Compilation *pCVar5;
  SyntaxNode *pSVar6;
  table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
  *arrays_;
  Scope *pSVar7;
  undefined1 auVar8 [16];
  int iVar9;
  unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
  *puVar10;
  ulong pos0;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t extraout_RDX_02;
  pointer ppPVar11;
  ulong uVar12;
  ulong hash;
  SmallVector<const_slang::ast::PortConnection_*,_5UL> *in_R9;
  uint uVar13;
  long lVar14;
  InstanceSymbol *instance;
  ulong uVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  undefined1 auVar20 [16];
  span<const_slang::ast::Symbol_*const,_18446744073709551615UL> ports;
  try_emplace_args_t local_b9;
  PortConnection *local_b8;
  ulong local_b0;
  Compilation *local_a8;
  pointer local_a0;
  InstanceSymbol *local_98;
  string_view *local_90;
  SmallVector<const_slang::ast::PortConnection_*,_5UL> conns;
  locator res;
  EVP_PKEY_CTX *extraout_RDX;
  
  pIVar3 = this->body;
  if ((pIVar3->super_Scope).deferredMemberIndex != Invalid) {
    Scope::elaborate(&pIVar3->super_Scope);
  }
  if (this->connectionMap == (PointerMap *)0x0) {
    instance = (InstanceSymbol *)(pIVar3->portList)._M_ptr;
    ppSVar4 = (pointer)(pIVar3->portList)._M_extent._M_extent_value;
    pCVar5 = ((this->super_InstanceSymbolBase).super_Symbol.parentScope)->compilation;
    puVar10 = TypedBumpAllocator<boost::unordered::unordered_flat_map<unsigned_long,_unsigned_long,_slang::hash<unsigned_long,_void>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>_>
              ::emplace<>(&pCVar5->pointerMapAllocator);
    this->connectionMap = puVar10;
    pSVar6 = (this->super_InstanceSymbolBase).super_Symbol.originatingSyntax;
    if ((pSVar6 == (SyntaxNode *)0x0) || (pSVar6->kind != HierarchicalInstance)) {
      pSVar7 = (this->super_InstanceSymbolBase).super_Symbol.parentScope;
      if ((pSVar7 != (Scope *)0x0) &&
         (((pSVar7->thisSym->kind == Root && (((this->body->flags).m_bits & 1) == 0)) &&
          (((pCVar5->options).flags.m_bits & 0x10) != 0)))) {
        connectDefaultIfacePorts(this);
        return;
      }
    }
    else {
      conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.data_ =
           (pointer)conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.firstElement;
      conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.len = 0;
      conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.cap = 5;
      ports._M_extent._M_extent_value = (size_t)(pSVar6 + 2);
      ports._M_ptr = ppSVar4;
      local_a8 = pCVar5;
      PortConnection::makeConnections
                ((PortConnection *)this,instance,ports,
                 (SeparatedSyntaxList<slang::syntax::PortConnectionSyntax> *)&conns,in_R9);
      src = extraout_RDX;
      if (conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.len != 0) {
        local_a0 = conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.data_ +
                   conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.len;
        ppPVar11 = conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.data_;
        local_98 = this;
        do {
          local_b8 = *ppPVar11;
          arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
                     *)local_98->connectionMap;
          local_b0 = *(ulong *)&(instance->super_InstanceSymbolBase).super_Symbol;
          instance = (InstanceSymbol *)&(instance->super_InstanceSymbolBase).super_Symbol.name;
          auVar8._8_8_ = 0;
          auVar8._0_8_ = local_b0;
          hash = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
          pos0 = hash >> ((byte)*arrays_ & 0x3f);
          uVar2 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[hash & 0xff];
          src = (EVP_PKEY_CTX *)(ulong)((uint)hash & 7);
          uVar15 = 0;
          uVar12 = pos0;
          do {
            pcVar1 = (char *)(*(long *)(arrays_ + 0x10) + uVar12 * 0x10);
            cVar16 = (char)uVar2;
            auVar20[0] = -(*pcVar1 == cVar16);
            cVar17 = (char)((uint)uVar2 >> 8);
            auVar20[1] = -(pcVar1[1] == cVar17);
            cVar18 = (char)((uint)uVar2 >> 0x10);
            auVar20[2] = -(pcVar1[2] == cVar18);
            cVar19 = (char)((uint)uVar2 >> 0x18);
            auVar20[3] = -(pcVar1[3] == cVar19);
            auVar20[4] = -(pcVar1[4] == cVar16);
            auVar20[5] = -(pcVar1[5] == cVar17);
            auVar20[6] = -(pcVar1[6] == cVar18);
            auVar20[7] = -(pcVar1[7] == cVar19);
            auVar20[8] = -(pcVar1[8] == cVar16);
            auVar20[9] = -(pcVar1[9] == cVar17);
            auVar20[10] = -(pcVar1[10] == cVar18);
            auVar20[0xb] = -(pcVar1[0xb] == cVar19);
            auVar20[0xc] = -(pcVar1[0xc] == cVar16);
            auVar20[0xd] = -(pcVar1[0xd] == cVar17);
            auVar20[0xe] = -(pcVar1[0xe] == cVar18);
            auVar20[0xf] = -(pcVar1[0xf] == cVar19);
            uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
            if (uVar13 != 0) {
              lVar14 = *(long *)(arrays_ + 0x18) + uVar12 * 0xf0;
              do {
                iVar9 = 0;
                if (uVar13 != 0) {
                  for (; (uVar13 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
                  }
                }
                if (*(ulong *)(lVar14 + (ulong)(uint)(iVar9 << 4)) == local_b0) {
                  lVar14 = (ulong)(uint)(iVar9 << 4) + lVar14;
                  goto LAB_001feba2;
                }
                uVar13 = uVar13 - 1 & uVar13;
              } while (uVar13 != 0);
            }
            if ((*(byte *)(uVar12 * 0x10 + *(long *)(arrays_ + 0x10) + 0xf) & (byte)src[0x47cb60])
                == 0) break;
            lVar14 = uVar12 + uVar15;
            uVar15 = uVar15 + 1;
            uVar12 = lVar14 + 1U & *(ulong *)(arrays_ + 8);
          } while (uVar15 <= *(ulong *)(arrays_ + 8));
          lVar14 = 0;
LAB_001feba2:
          local_90 = (string_view *)instance;
          if (lVar14 == 0) {
            if (*(ulong *)(arrays_ + 0x28) < *(ulong *)(arrays_ + 0x20)) {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
              ::
              nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                        (&res,arrays_,(arrays_type *)arrays_,pos0,hash,&local_b9,&local_b0,
                         (unsigned_long *)&local_b8);
              *(long *)(arrays_ + 0x28) = *(long *)(arrays_ + 0x28) + 1;
              src = extraout_RDX_00;
            }
            else {
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<unsigned_long,unsigned_long>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<unsigned_long,void>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long_const,unsigned_long>>>
              ::
              unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,unsigned_long,unsigned_long>
                        (&res,arrays_,hash,&local_b9,&local_b0,(unsigned_long *)&local_b8);
              src = extraout_RDX_01;
            }
          }
          ppPVar11 = ppPVar11 + 1;
          this = local_98;
        } while (ppPVar11 != local_a0);
      }
      iVar9 = SmallVectorBase<const_slang::ast::PortConnection_*>::copy
                        (&conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>,
                         (EVP_PKEY_CTX *)local_a8,src);
      (this->connections)._M_ptr = (pointer)CONCAT44(extraout_var,iVar9);
      (this->connections)._M_extent._M_extent_value = extraout_RDX_02;
      if (conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.data_ !=
          (pointer)conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.firstElement) {
        operator_delete(conns.super_SmallVectorBase<const_slang::ast::PortConnection_*>.data_);
      }
    }
  }
  return;
}

Assistant:

void InstanceSymbol::resolvePortConnections() const {
    // Note: the order of operations here is very subtly important.
    // In order to resolve connections, we need to actually know our list of ports.
    // Asking the body for the list of ports requires fully elaborating the instance,
    // especially because of things like non-ansi port declarations which might be
    // deep in the body. That process of elaboration can actually depend back on the
    // port connections because of interface ports.
    // For example:
    //
    //     interface I #(parameter int i) (); endinterface
    //     module M(I iface, input logic [iface.i - 1 : 0] foo);
    //         localparam int j = $bits(foo);
    //     endmodule
    //
    // In order to resolve connections for an instance of M, we elaborate its body,
    // which then requires evaluating $bits(foo) which then depends on the connection
    // provided to `iface`. In the code, this translates to a reetrant call to this
    // function; the first time we call getPortList() on the body will call back in here.
    auto portList = body.getPortList();
    if (connectionMap)
        return;

    auto scope = getParentScope();
    SLANG_ASSERT(scope);

    auto& comp = scope->getCompilation();
    connectionMap = comp.allocPointerMap();

    auto syntax = getSyntax();
    if (!syntax || syntax->kind != SyntaxKind::HierarchicalInstance) {
        // If this is a top level module and we have interface ports, the user has
        // the option of allowing it by automatically instantiating interface instances
        // to connect them to.
        if (isTopLevel() && comp.hasFlag(CompilationFlags::AllowTopLevelIfacePorts))
            connectDefaultIfacePorts();
        return;
    }

    SmallVector<const PortConnection*> conns;
    PortConnection::makeConnections(*this, portList,
                                    syntax->as<HierarchicalInstanceSyntax>().connections, conns);

    auto portIt = portList.begin();
    for (auto conn : conns) {
        SLANG_ASSERT(portIt != portList.end());
        connectionMap->emplace(reinterpret_cast<uintptr_t>(*portIt++),
                               reinterpret_cast<uintptr_t>(conn));
    }

    SLANG_ASSERT(portIt == portList.end());
    connections = conns.copy(comp);
}